

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
* __thiscall
vkt::shaderexecutor::
generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
          (Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
           *__return_storage_ptr__,shaderexecutor *this,
          Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *samplings,FloatFormat *floatFormat,Precision intPrecision,size_t numSamples,deUint32 seed
          )

{
  iterator iVar1;
  undefined4 uVar2;
  shaderexecutor *psVar3;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *pSVar4;
  float *pfVar5;
  const_iterator cVar6;
  long lVar7;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *pvVar8;
  float *pfVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined4 in_register_00000084;
  long lVar14;
  ulong uVar15;
  vector<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_> *pvVar16;
  bool bVar17;
  In3 in3;
  In2 in2;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  fixedInputs;
  InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  tuple;
  set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  seenInputs;
  Random rnd;
  In1 in1;
  In0 in0;
  Void local_1b2;
  Void local_1b1;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_1b0;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_1a8;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_1a0;
  vector<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_> *local_198;
  undefined4 local_18c;
  void *local_188;
  void *pvStack_180;
  long local_178;
  void *pvStack_170;
  void *local_168;
  long lStack_160;
  void *local_158;
  void *pvStack_150;
  long local_148;
  void *pvStack_140;
  void *local_138;
  long lStack_130;
  undefined1 *local_120;
  shaderexecutor *local_118;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *local_110;
  ulong local_108;
  ulong local_100;
  float local_f8 [8];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Void local_b8;
  Void local_b7 [7];
  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  local_b0;
  deRandom local_80;
  value_type local_70;
  float local_50 [8];
  
  local_120 = (undefined1 *)CONCAT44(in_register_00000084,intPrecision);
  local_18c = SUB84(floatFormat,0);
  deRandom_init(&local_80,(deUint32)numSamples);
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138 = (void *)0x0;
  lStack_130 = 0;
  local_148 = 0;
  pvStack_140 = (void *)0x0;
  local_158 = (void *)0x0;
  pvStack_150 = (void *)0x0;
  local_168 = (void *)0x0;
  lStack_160 = 0;
  local_178 = 0;
  pvStack_170 = (void *)0x0;
  local_188 = (void *)0x0;
  pvStack_180 = (void *)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)**(undefined8 **)this)(*(undefined8 **)this,samplings);
  (**(code **)**(undefined8 **)(this + 8))(*(undefined8 **)(this + 8),samplings,&pvStack_170);
  (**(code **)**(undefined8 **)(this + 0x10))(*(undefined8 **)(this + 0x10),samplings,&local_158);
  (**(code **)**(undefined8 **)(this + 0x18))(*(undefined8 **)(this + 0x18),samplings,&pvStack_140);
  local_118 = this;
  local_110 = samplings;
  if (pvStack_180 != local_188) {
    local_198 = &__return_storage_ptr__->in1;
    local_1a0 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in2;
    local_1a8 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in3;
    lVar14 = 0;
    uVar15 = 0;
    do {
      local_108 = uVar15;
      if (local_168 != pvStack_170) {
        lVar12 = 0;
        uVar15 = 0;
        do {
          local_100 = uVar15;
          if (pvStack_150 != local_158) {
            pvVar8 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                     0x0;
            do {
              local_1b0 = pvVar8;
              if (local_138 != pvStack_140) {
                uVar15 = 0;
                do {
                  local_f8[0] = 0.0;
                  local_f8[1] = 0.0;
                  local_f8[2] = 0.0;
                  local_f8[3] = 0.0;
                  local_f8[4] = 0.0;
                  local_f8[5] = 0.0;
                  local_f8[6] = 0.0;
                  local_f8[7] = 0.0;
                  lVar7 = (long)local_188 + lVar14;
                  pfVar5 = local_f8;
                  lVar11 = 0;
                  do {
                    lVar13 = 0;
                    do {
                      pfVar5[lVar13 * 2] = *(float *)(lVar7 + lVar13 * 8);
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 4);
                    pfVar5 = pfVar5 + 1;
                    lVar7 = lVar7 + 4;
                    bVar17 = lVar11 == 0;
                    lVar11 = lVar11 + 1;
                  } while (bVar17);
                  local_c8 = 0;
                  uStack_c0 = 0;
                  local_d8 = 0;
                  uStack_d0 = 0;
                  lVar7 = (long)pvStack_170 + lVar12;
                  pfVar5 = (float *)&local_d8;
                  lVar11 = 0;
                  do {
                    lVar13 = 0;
                    do {
                      pfVar5[lVar13 * 2] = *(float *)(lVar7 + lVar13 * 8);
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 4);
                    pfVar5 = pfVar5 + 1;
                    lVar7 = lVar7 + 4;
                    bVar17 = lVar11 == 0;
                    lVar11 = lVar11 + 1;
                  } while (bVar17);
                  std::
                  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                  ::
                  _M_insert_unique<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>const&>
                            ((_Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                              *)&local_b0,
                             (InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                              *)local_f8);
                  std::vector<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                  ::push_back(&__return_storage_ptr__->in0,(value_type *)local_f8);
                  std::vector<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                  ::push_back(local_198,(value_type *)&local_d8);
                  iVar1._M_current =
                       (__return_storage_ptr__->in2).
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in2).
                      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                    ::_M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_1a0,iVar1,&local_b8)
                    ;
                  }
                  else {
                    (__return_storage_ptr__->in2).
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  iVar1._M_current =
                       (__return_storage_ptr__->in3).
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in3).
                      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                    ::_M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_1a8,iVar1,local_b7);
                  }
                  else {
                    (__return_storage_ptr__->in3).
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar15 < (ulong)((long)local_138 - (long)pvStack_140));
              }
              pvVar8 = local_1b0 + 1;
            } while (pvVar8 < (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                               *)((long)pvStack_150 - (long)local_158));
          }
          uVar15 = local_100 + 1;
          lVar12 = lVar12 + 0x20;
        } while (uVar15 < (ulong)((long)local_168 - (long)pvStack_170 >> 5));
      }
      uVar15 = local_108 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar15 < (ulong)((long)pvStack_180 - (long)local_188 >> 5));
  }
  if (local_120 != (undefined1 *)0x0) {
    local_1a0 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in1;
    local_1a8 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in2;
    local_1b0 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in3;
    pvVar16 = (vector<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_> *)0x0;
    do {
      pSVar4 = local_110;
      psVar3 = local_118;
      uVar2 = local_18c;
      local_198 = pvVar16;
      (**(code **)(**(long **)local_118 + 8))
                (local_50,*(long **)local_118,local_110,local_18c,&local_80);
      (**(code **)(**(long **)(psVar3 + 8) + 8))
                (&local_70,*(long **)(psVar3 + 8),pSVar4,uVar2,&local_80);
      (**(code **)(**(long **)(psVar3 + 0x10) + 8))
                (*(long **)(psVar3 + 0x10),pSVar4,uVar2,&local_80);
      (**(code **)(**(long **)(psVar3 + 0x18) + 8))
                (*(long **)(psVar3 + 0x18),pSVar4,uVar2,&local_80);
      pvVar16 = local_198;
      local_f8[4] = 0.0;
      local_f8[5] = 0.0;
      local_f8[6] = 0.0;
      local_f8[7] = 0.0;
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      local_f8[3] = 0.0;
      pfVar5 = local_50;
      pfVar9 = local_f8;
      lVar14 = 0;
      do {
        lVar12 = 0;
        do {
          pfVar9[lVar12 * 2] = pfVar5[lVar12 * 2];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        pfVar9 = pfVar9 + 1;
        pfVar5 = pfVar5 + 1;
        bVar17 = lVar14 == 0;
        lVar14 = lVar14 + 1;
      } while (bVar17);
      puVar10 = &local_d8;
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      pfVar5 = (float *)&local_70;
      lVar14 = 0;
      do {
        lVar12 = 0;
        do {
          *(float *)(puVar10 + lVar12) = pfVar5[lVar12 * 2];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        puVar10 = (undefined8 *)((long)puVar10 + 4);
        pfVar5 = pfVar5 + 1;
        bVar17 = lVar14 == 0;
        lVar14 = lVar14 + 1;
      } while (bVar17);
      cVar6 = std::
              _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
              ::find(&local_b0,(key_type *)local_f8);
      if ((_Rb_tree_header *)cVar6._M_node == &local_b0._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
        ::
        _M_insert_unique<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>const&>
                  ((_Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                    *)&local_b0,
                   (InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                    *)local_f8);
        std::vector<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>::push_back
                  (&__return_storage_ptr__->in0,(value_type *)local_50);
        std::vector<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>::push_back
                  ((vector<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_> *)
                   local_1a0,&local_70);
        iVar1._M_current =
             (__return_storage_ptr__->in2).
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in2).
            super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>::
          _M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_1a8,iVar1,&local_1b1);
        }
        else {
          (__return_storage_ptr__->in2).
          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (__return_storage_ptr__->in3).
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in3).
            super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>::
          _M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_1b0,iVar1,&local_1b2);
        }
        else {
          (__return_storage_ptr__->in3).
          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      pvVar16 = (vector<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_> *)
                ((long)&(pvVar16->
                        super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
    } while (pvVar16 !=
             (vector<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_> *)
             local_120);
  }
  std::
  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  ::~_Rb_tree(&local_b0);
  if (pvStack_140 != (void *)0x0) {
    operator_delete(pvStack_140,lStack_130 - (long)pvStack_140);
  }
  if (local_158 != (void *)0x0) {
    operator_delete(local_158,local_148 - (long)local_158);
  }
  if (pvStack_170 != (void *)0x0) {
    operator_delete(pvStack_170,lStack_160 - (long)pvStack_170);
  }
  if (local_188 != (void *)0x0) {
    operator_delete(local_188,local_178 - (long)local_188);
  }
  return __return_storage_ptr__;
}

Assistant:

Inputs<In> generateInputs (const Samplings<In>&	samplings,
						   const FloatFormat&	floatFormat,
						   Precision			intPrecision,
						   size_t				numSamples,
						   deUint32				seed)
{
	Random										rnd(seed);
	Inputs<In>									ret;
	Inputs<In>									fixedInputs;
	set<InTuple<In>, InputLess<InTuple<In> > >	seenInputs;

	samplings.in0.genFixeds(floatFormat, fixedInputs.in0);
	samplings.in1.genFixeds(floatFormat, fixedInputs.in1);
	samplings.in2.genFixeds(floatFormat, fixedInputs.in2);
	samplings.in3.genFixeds(floatFormat, fixedInputs.in3);

	for (size_t ndx0 = 0; ndx0 < fixedInputs.in0.size(); ++ndx0)
	{
		for (size_t ndx1 = 0; ndx1 < fixedInputs.in1.size(); ++ndx1)
		{
			for (size_t ndx2 = 0; ndx2 < fixedInputs.in2.size(); ++ndx2)
			{
				for (size_t ndx3 = 0; ndx3 < fixedInputs.in3.size(); ++ndx3)
				{
					const InTuple<In>	tuple	(fixedInputs.in0[ndx0],
												 fixedInputs.in1[ndx1],
												 fixedInputs.in2[ndx2],
												 fixedInputs.in3[ndx3]);

					seenInputs.insert(tuple);
					ret.in0.push_back(tuple.a);
					ret.in1.push_back(tuple.b);
					ret.in2.push_back(tuple.c);
					ret.in3.push_back(tuple.d);
				}
			}
		}
	}

	for (size_t ndx = 0; ndx < numSamples; ++ndx)
	{
		const typename In::In0	in0		= samplings.in0.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In1	in1		= samplings.in1.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In2	in2		= samplings.in2.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In3	in3		= samplings.in3.genRandom(floatFormat, intPrecision, rnd);
		const InTuple<In>		tuple	(in0, in1, in2, in3);

		if (de::contains(seenInputs, tuple))
			continue;

		seenInputs.insert(tuple);
		ret.in0.push_back(in0);
		ret.in1.push_back(in1);
		ret.in2.push_back(in2);
		ret.in3.push_back(in3);
	}

	return ret;
}